

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minipoint-counter.cpp
# Opt level: O1

int __thiscall mahjong::MinipointCounter::total(MinipointCounter *this,bool is_round_up)

{
  bool bVar1;
  int iVar2;
  double dVar3;
  
  bVar1 = isNoPointsHandSelfDrawn(this);
  iVar2 = 0x14;
  if ((!bVar1) &&
     (iVar2 = 0x19,
     (long)(this->hand->pairs).super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
           _M_impl.super__Vector_impl_data._M_finish -
     (long)(this->hand->pairs).super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
           _M_impl.super__Vector_impl_data._M_start != 0xa8)) {
    this->point = 0x14;
    computeWining(this);
    computeMelds(this);
    computePair(this);
    computeWait(this);
    if (this->point == 0x14) {
      this->point = 0x1e;
    }
    iVar2 = this->point;
    if (is_round_up) {
      dVar3 = ceil((double)iVar2 / 10.0);
      iVar2 = (int)(dVar3 * 10.0);
    }
  }
  return iVar2;
}

Assistant:

int MinipointCounter::total(bool is_round_up)
{
	if (isNoPointsHandSelfDrawn()) return 20;
	if (isSevenPairs()) return 25;

	point = 20;

	computeWining();
	computeMelds();
	computePair();
	computeWait();
	computeOpenNoPointsHand();

	return is_round_up ? roundUp(point) : point;
}